

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O3

LY_ERR ly_set_merge(ly_set *trg,ly_set *src,ly_bool list,_func_void_ptr_void_ptr *duplicator)

{
  LY_ERR LVar1;
  lyd_node *object;
  ulong uVar2;
  
  if (trg == (ly_set *)0x0) {
    LVar1 = LY_EINVAL;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","trg","ly_set_merge");
  }
  else {
    LVar1 = LY_SUCCESS;
    if ((src != (ly_set *)0x0) && (LVar1 = LY_SUCCESS, src->count != 0)) {
      uVar2 = 0;
      do {
        object = (src->field_2).dnodes[uVar2];
        if (duplicator != (_func_void_ptr_void_ptr *)0x0) {
          object = (lyd_node *)(*duplicator)(object);
        }
        LVar1 = ly_set_add(trg,object,list,(uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < src->count);
      LVar1 = LY_SUCCESS;
    }
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_set_merge(struct ly_set *trg, const struct ly_set *src, ly_bool list, void *(*duplicator)(const void *obj))
{
    uint32_t u;
    void *obj;

    LY_CHECK_ARG_RET(NULL, trg, LY_EINVAL);

    if (!src) {
        /* nothing to do */
        return LY_SUCCESS;
    }

    for (u = 0; u < src->count; ++u) {
        if (duplicator) {
            obj = duplicator(src->objs[u]);
        } else {
            obj = src->objs[u];
        }
        LY_CHECK_RET(ly_set_add(trg, obj, list, NULL));
    }

    return LY_SUCCESS;
}